

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O0

void __thiscall
BssSectionImport_ZeroSizeSuccess_Test::TestBody(BssSectionImport_ZeroSizeSuccess_Test *this)

{
  not_null<pstore::repo::section_content_*> content;
  bool bVar1;
  Message *pMVar2;
  error_code *this_00;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected_predicate_value;
  undefined5 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6d;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  string local_418;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_3b0;
  Message local_3a8;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_368;
  Message local_360;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__1;
  Message local_338;
  uint local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_1;
  Message local_310;
  section_kind local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar;
  string local_2e8;
  AssertHelper local_2c8;
  string local_2c0;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_;
  undefined1 local_278 [136];
  string local_1f0 [32];
  parser<pstore::exchange::import_ns::callbacks> local_1d0;
  parser<pstore::exchange::import_ns::callbacks> *local_128;
  parser<pstore::exchange::import_ns::callbacks> *parser;
  section_content imported_content;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  local_30;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  BssSectionImport_ZeroSizeSuccess_Test *this_local;
  
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
            *)&inserter);
  local_30 = std::
             back_inserter<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>
                       ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                         *)&inserter);
  pstore::repo::section_content::section_content((section_content *)&parser);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f0,"{ \"align\":8, \"size\":0 }",(allocator *)(local_278 + 0x87));
  local_278._112_8_ = 0;
  local_278._120_8_ = (mutex_type *)0x0;
  local_278._96_8_ = 0;
  local_278._104_8_ = 0;
  local_278._80_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278._88_8_ = (_Hash_node_base *)0x0;
  local_278._64_8_ = (pointer)0x0;
  local_278._72_8_ = (element_type *)0x0;
  local_278._48_8_ = (_List_node_base *)0x0;
  local_278._56_8_ = (_List_node_base *)0x0;
  local_278._32_8_ =
       (__uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
        )0x0;
  local_278._40_8_ =
       (__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>)0x0;
  local_278._16_8_ = (pointer)0x0;
  local_278._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ =
       (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )0x0;
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)local_278);
  pstore::gsl::not_null<pstore::repo::section_content_*>::not_null
            ((not_null<pstore::repo::section_content_*> *)&gtest_ar_.message_,
             (section_content *)&parser);
  content.ptr_._5_1_ = in_stack_fffffffffffffb6d;
  content.ptr_._0_5_ = in_stack_fffffffffffffb68;
  content.ptr_._6_1_ = in_stack_fffffffffffffb6e;
  content.ptr_._7_1_ = in_stack_fffffffffffffb6f;
  (anonymous_namespace)::
  parse<(pstore::repo::section_kind)2,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
            (&local_1d0,(_anonymous_namespace_ *)local_1f0,
             (string *)&(this->super_BssSectionImport).db_,(database *)local_278,
             (string_mapping *)&stack0xffffffffffffffd0,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,content);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_278);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_278 + 0x87));
  local_128 = &local_1d0;
  local_291 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error(local_128);
  local_291 = !local_291;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  expected_predicate_value =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       gtest_ar_.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pMVar2 = testing::Message::operator<<(&local_2a0,(char (*) [17])"JSON error was: ");
    this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error(local_128);
    std::error_code::message_abi_cxx11_(&local_2c0,this_00);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e8,(internal *)local_290,(AssertionResult *)0x2ecd1e,"true","false",
               (char *)gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0xd2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2c0);
    testing::Message::~Message(&local_2a0);
    expected_predicate_value =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         gtest_ar_.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_301 = bss;
    testing::internal::EqHelper::
    Compare<pstore::repo::section_kind,_pstore::repo::section_kind,_nullptr>
              ((EqHelper *)local_300,"imported_content.kind","pstore::repo::section_kind::bss",
               (section_kind *)&parser,&local_301);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
    if (!bVar1) {
      testing::Message::Message(&local_310);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd4,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_310);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_310);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
    local_32c = 8;
    testing::internal::EqHelper::Compare<unsigned_char,_unsigned_int,_nullptr>
              ((EqHelper *)local_328,"imported_content.align","8U",(uchar *)((long)&parser + 1),
               &local_32c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
    if (!bVar1) {
      testing::Message::Message(&local_338);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_338);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_338);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
    local_351 = pstore::small_vector<unsigned_char,_128UL>::empty
                          ((small_vector<unsigned_char,_128UL> *)&imported_content);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_350,&local_351,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
    if (!bVar1) {
      testing::Message::Message(&local_360);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_350,
                 (AssertionResult *)"imported_content.data.empty ()","false","true",
                 (char *)expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_368,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_368,&local_360);
      testing::internal::AssertHelper::~AssertHelper(&local_368);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_360);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
    local_399 = std::
                vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                ::empty((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                         *)&imported_content.data.buffer_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_398,&local_399,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
    if (!bVar1) {
      testing::Message::Message(&local_3a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_398,
                 (AssertionResult *)"imported_content.ifixups.empty ()","false","true",
                 (char *)expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper(&local_3b0);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_3a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
    local_3e1 = std::
                vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                ::empty((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                         *)&imported_content.ifixups.
                            super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_418,(internal *)local_3e0,
                 (AssertionResult *)"imported_content.xfixups.empty ()","false","true",
                 (char *)expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      testing::Message::~Message(&local_3f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&local_1d0);
  pstore::repo::section_content::~section_content((section_content *)&parser);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)&inserter);
  return;
}

Assistant:

TEST_F (BssSectionImport, ZeroSizeSuccess) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    auto const & parser = parse<pstore::repo::section_kind::bss> (
        R"({ "align":8, "size":0 })", &db_, pstore::exchange::import_ns::string_mapping{},
        &inserter, &imported_content);
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    EXPECT_EQ (imported_content.kind, pstore::repo::section_kind::bss);
    EXPECT_EQ (imported_content.align, 8U);
    EXPECT_TRUE (imported_content.data.empty ());
    EXPECT_TRUE (imported_content.ifixups.empty ());
    EXPECT_TRUE (imported_content.xfixups.empty ());
}